

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::replace(String *this,size_t pos1,size_t n1,char *s)

{
  undefined1 local_48 [8];
  String tmp;
  char *s_local;
  size_t n1_local;
  size_t pos1_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = s;
  String((String *)local_48,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,pos1,n1,
          (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_48)
  ;
  ~String((String *)local_48);
  return this;
}

Assistant:

String& String::replace( size_t pos1, size_t n1, const char* s ) {
	String tmp( s );

	mString.replace( pos1, n1, tmp.mString );

	return *this;
}